

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::yml::Parser::_filter_nl<true,true>
          (Parser *this,substr r,size_t *i,size_t *pos,size_t indentation)

{
  long lVar1;
  long lVar2;
  csubstr r_00;
  bool bVar3;
  error_flags eVar4;
  size_t sVar5;
  ulong uVar6;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  long in_R9;
  ro_substr rVar7;
  char next;
  size_t j;
  size_t numnl_following;
  size_t ii;
  char msg_1 [29];
  char msg [36];
  bool replaced;
  char curr;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char cVar8;
  code *in_stack_fffffffffffffea0;
  basic_substring<char> *in_stack_fffffffffffffea8;
  code *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  basic_substring<char_const> local_128 [16];
  ulong local_118;
  size_t *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  char local_c8 [48];
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  basic_substring<char> local_78 [2];
  byte local_52;
  char local_51;
  long local_50;
  long *local_48;
  ulong *local_40;
  long local_30;
  ulong local_28;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  local_10 = *in_RCX;
  local_8 = &local_30;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_30 = in_RSI;
  local_28 = in_RDX;
  if (in_RDX <= local_10) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) &&
       (in_stack_fffffffffffffebf = is_debugger_attached(), (bool)in_stack_fffffffffffffebf)) {
      trap_instruction();
    }
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_18 = 0x14c3;
    handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
  }
  local_51 = *(char *)(local_30 + local_10);
  local_52 = 0;
  if (local_50 == -1) {
    memcpy(local_78,"check failed: (indentation != npos)",0x24);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    in_stack_fffffffffffffeb0 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffea8 = local_78;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                       in_stack_fffffffffffffe88,
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    (*in_stack_fffffffffffffeb0)(in_stack_fffffffffffffea8,0x24,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe70 = uStack_98;
    in_stack_fffffffffffffe74 = uStack_94;
    in_stack_fffffffffffffe78 = local_90;
    in_stack_fffffffffffffe7c = uStack_8c;
    in_stack_fffffffffffffe80 = uStack_88;
    in_stack_fffffffffffffe84 = uStack_84;
    in_stack_fffffffffffffe88 = local_80;
  }
  if (local_51 != '\n') {
    builtin_strncpy(local_c8,"check failed: (curr == \'\\n\')",0x1d);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    in_stack_fffffffffffffea0 = *(code **)(in_RDI + 0x9e8);
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                       in_stack_fffffffffffffe88,
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    (*in_stack_fffffffffffffea0)(local_c8,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
  }
  uVar6 = *local_40;
  rVar7 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x335cc8);
  r_00.len._0_4_ = in_stack_ffffffffffffff10;
  r_00.str = (char *)uVar6;
  r_00.len._4_4_ = in_stack_ffffffffffffff14;
  sVar5 = anon_unknown_0::count_following_newlines(r_00,in_stack_ffffffffffffff00,rVar7.len);
  if (sVar5 == 0) {
    basic_substring<char_const>::basic_substring<3ul>(local_128,(char (*) [3])" \t");
    rVar7.len._0_7_ = in_stack_fffffffffffffeb8;
    rVar7.str = (char *)in_stack_fffffffffffffeb0;
    rVar7.len._7_1_ = in_stack_fffffffffffffebf;
    sVar5 = basic_substring<char>::first_not_of
                      (in_stack_fffffffffffffea8,rVar7,(size_t)in_stack_fffffffffffffea0);
    if (sVar5 == 0xffffffffffffffff) {
      lVar1 = *(long *)(in_RDI + 0xa78);
      lVar2 = *local_48;
      *local_48 = lVar2 + 1;
      *(undefined1 *)(lVar1 + lVar2) = 0x20;
    }
    else {
      lVar1 = *(long *)(in_RDI + 0xa78);
      lVar2 = *local_48;
      *local_48 = lVar2 + 1;
      *(undefined1 *)(lVar1 + lVar2) = 0x20;
    }
    local_52 = 1;
    if ((uVar6 < local_28) && (*(char *)(local_30 + uVar6) == '\\')) {
      if (uVar6 + 1 < local_28) {
        cVar8 = *(char *)(local_30 + 1 + uVar6);
      }
      else {
        cVar8 = '\0';
      }
      if ((cVar8 == ' ') || (cVar8 == '\t')) {
        uVar6 = uVar6 + 1;
      }
    }
  }
  else {
    for (local_118 = 0; local_118 < sVar5; local_118 = local_118 + 1) {
      lVar1 = *(long *)(in_RDI + 0xa78);
      lVar2 = *local_48;
      *local_48 = lVar2 + 1;
      *(undefined1 *)(lVar1 + lVar2) = 10;
    }
  }
  *local_40 = uVar6 - 1;
  return (bool)(local_52 & 1);
}

Assistant:

bool Parser::_filter_nl(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfnl(fmt, ...) _c4dbgpf("filter_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfnl(...)
    #endif

    const char curr = r[*i];
    bool replaced = false;

    _RYML_CB_ASSERT(m_stack.m_callbacks, indentation != npos);
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == '\n');

    _c4dbgfnl("found newline. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
    size_t ii = *i;
    size_t numnl_following = count_following_newlines(r, &ii, indentation);
    if(numnl_following)
    {
        _c4dbgfnl("{} consecutive (empty) lines {} in the middle. totalws={}", 1+numnl_following, ii < r.len ? "in the middle" : "at the end", ii - *i);
        for(size_t j = 0; j < numnl_following; ++j)
            m_filter_arena.str[(*pos)++] = '\n';
    }
    else
    {
        if(r.first_not_of(" \t", *i+1) != npos)
        {
            m_filter_arena.str[(*pos)++] = ' ';
            _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
            replaced = true;
        }
        else
        {
            if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            {
                m_filter_arena.str[(*pos)++] = ' ';
                _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
                replaced = true;
            }
            else
            {
                _c4dbgfnl("last newline, everything else is whitespace. ii={}/{}", ii, r.len);
                *i = r.len;
            }
        }
        if C4_IF_CONSTEXPR (backslash_is_escape)
        {
            if(ii < r.len && r.str[ii] == '\\')
            {
                const char next = ii+1 < r.len ? r.str[ii+1] : '\0';
                if(next == ' ' || next == '\t')
                {
                    _c4dbgfnl("extend skip to backslash{}", "");
                    ++ii;
                }
            }
        }
    }
    *i = ii - 1; // correct for the loop increment

    #undef _c4dbgfnl

    return replaced;
}